

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

void __thiscall
ON_Xform::Rotation(ON_Xform *this,ON_3dVector start_dir,ON_3dVector end_dir,
                  ON_3dPoint rotation_center)

{
  ON_3dVector axis;
  bool bVar1;
  double dVar2;
  double sin_angle;
  ON_3dVector local_40;
  
  dVar2 = ON_3dVector::Length(&start_dir);
  if (1.490116119385e-08 < ABS(dVar2 + -1.0)) {
    ON_3dVector::Unitize(&start_dir);
  }
  dVar2 = ON_3dVector::Length(&end_dir);
  if (1.490116119385e-08 < ABS(dVar2 + -1.0)) {
    ON_3dVector::Unitize(&end_dir);
  }
  dVar2 = ON_3dVector::operator*(&start_dir,&end_dir);
  ON_CrossProduct(&local_40,&start_dir,&end_dir);
  sin_angle = ON_3dVector::Length(&local_40);
  if (((sin_angle == 0.0) && (!NAN(sin_angle))) || (bVar1 = ON_3dVector::Unitize(&local_40), !bVar1)
     ) {
    ON_3dVector::PerpendicularTo(&local_40,&start_dir);
    ON_3dVector::Unitize(&local_40);
    sin_angle = 0.0;
    dVar2 = *(double *)(&DAT_006a8450 + (ulong)(dVar2 < 0.0) * 8);
  }
  axis.y = local_40.y;
  axis.x = local_40.x;
  axis.z = local_40.z;
  Rotation(this,sin_angle,dVar2,axis,rotation_center);
  return;
}

Assistant:

void ON_Xform::Rotation(
  ON_3dVector start_dir,
  ON_3dVector end_dir,
  ON_3dPoint rotation_center
  )
{
  if ( fabs(start_dir.Length()-1.0) > ON_SQRT_EPSILON )
    start_dir.Unitize();
  if ( fabs(end_dir.Length()-1.0) > ON_SQRT_EPSILON )
    end_dir.Unitize();
  double cos_angle = start_dir*end_dir;
  ON_3dVector axis = ON_CrossProduct(start_dir,end_dir);
  double sin_angle = axis.Length();
  if ( 0.0 == sin_angle || !axis.Unitize() )
  {
    axis.PerpendicularTo(start_dir);
    axis.Unitize();
    sin_angle = 0.0;
    cos_angle = (cos_angle < 0.0) ? -1.0 : 1.0;
  }
  Rotation(sin_angle,cos_angle,axis,rotation_center);
}